

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O2

void DrawBoingBallBand(GLfloat long_lo,GLfloat long_hi)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double __x_00;
  double dVar8;
  GLfloat GVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  GLfloat GVar14;
  float fVar15;
  GLfloat GVar16;
  float fVar17;
  float fVar18;
  ulong uVar19;
  vertex_t a;
  vertex_t b;
  vertex_t c;
  vertex_t vert_norm;
  undefined8 local_98;
  
  uVar19 = 0x401921fb54442d18;
  __x_00 = ((double)long_lo / 360.0) * 6.283185307179586;
  __x = ((double)(long_lo + 22.5) / 360.0) * 6.283185307179586;
  fVar10 = 0.0;
  while (fVar10 <= 337.5) {
    if (DrawBoingBallBand::colorToggle == 0) {
      GVar9 = 0.95;
      GVar14 = 0.95;
      GVar16 = 0.95;
    }
    else {
      GVar9 = 0.8;
      GVar14 = 0.1;
      GVar16 = 0.1;
    }
    (*glad_glColor3f)(GVar9,GVar14,GVar16);
    DrawBoingBallBand::colorToggle = (int)(DrawBoingBallBand::colorToggle == 0);
    if (drawBallHow == DRAW_BALL_SHADOW) {
      (*glad_glColor3f)(0.35,0.35,0.35);
    }
    dVar1 = cos(((double)long_hi / 360.0) * 6.283185307179586);
    fVar15 = (float)dVar1 * 70.0;
    dVar1 = cos(__x_00);
    dVar8 = ((double)fVar10 / 360.0) * 6.283185307179586;
    dVar2 = cos(dVar8);
    dVar3 = sin(__x);
    a.x = (float)dVar3 * 70.0 * (float)dVar2;
    dVar2 = cos(dVar8);
    dVar3 = sin(__x_00);
    fVar10 = fVar10 + 22.5;
    dVar4 = ((double)fVar10 / 360.0) * 6.283185307179586;
    dVar5 = cos(dVar4);
    dVar6 = sin(__x);
    fVar11 = (float)dVar6 * 70.0 * (float)dVar5;
    dVar5 = cos(dVar4);
    dVar6 = sin(__x_00);
    fVar17 = (float)dVar5 * (float)dVar6 * 70.0;
    fVar18 = (float)dVar1 * 70.0;
    dVar1 = sin(dVar8);
    dVar5 = sin(__x);
    fVar12 = (float)dVar5 * 70.0 * (float)dVar1;
    dVar1 = sin(dVar8);
    dVar5 = sin(__x_00);
    dVar6 = sin(dVar4);
    dVar8 = sin(__x);
    dVar4 = sin(dVar4);
    dVar7 = sin(__x_00);
    fVar13 = (float)dVar7 * 70.0 * (float)dVar4;
    (*glad_glBegin)(9);
    a.y = fVar15;
    a.z = fVar12;
    b.y = fVar15;
    b.x = fVar11;
    b.z = (float)uVar19;
    uVar19 = uVar19 & 0xffffffff;
    c.z = fVar13;
    c.x = fVar17;
    c.y = fVar18;
    CrossProduct(a,b,c,&vert_norm);
    (*glad_glNormal3f)(vert_norm.x,vert_norm.y,vert_norm.z);
    (*glad_glVertex3f)(a.x,fVar15,fVar12);
    (*glad_glVertex3f)(fVar11,fVar15,(float)dVar8 * 70.0 * (float)dVar6);
    (*glad_glVertex3f)(fVar17,fVar18,fVar13);
    (*glad_glVertex3f)((float)dVar3 * 70.0 * (float)dVar2,fVar18,(float)dVar5 * 70.0 * (float)dVar1)
    ;
    (*glad_glEnd)();
  }
  DrawBoingBallBand::colorToggle = (uint)(DrawBoingBallBand::colorToggle == 0);
  return;
}

Assistant:

void DrawBoingBallBand( GLfloat long_lo,
                        GLfloat long_hi )
{
   vertex_t vert_ne;            /* "ne" means south-east, so on */
   vertex_t vert_nw;
   vertex_t vert_sw;
   vertex_t vert_se;
   vertex_t vert_norm;
   GLfloat  lat_deg;
   static int colorToggle = 0;

  /*
   * Iterate through the points of a latitude circle.
   * A latitude circle is a 2D set of X,Z points.
   */
   for ( lat_deg = 0;
         lat_deg <= (360 - STEP_LATITUDE);
         lat_deg += STEP_LATITUDE )
   {
     /*
      * Color this polygon with red or white.
      */
      if ( colorToggle )
         glColor3f( 0.8f, 0.1f, 0.1f );
      else
         glColor3f( 0.95f, 0.95f, 0.95f );
#if 0
      if ( lat_deg >= 180 )
         if ( colorToggle )
            glColor3f( 0.1f, 0.8f, 0.1f );
         else
            glColor3f( 0.5f, 0.5f, 0.95f );
#endif
      colorToggle = ! colorToggle;

     /*
      * Change color if drawing shadow.
      */
      if ( drawBallHow == DRAW_BALL_SHADOW )
         glColor3f( 0.35f, 0.35f, 0.35f );

     /*
      * Assign each Y.
      */
      vert_ne.y = vert_nw.y = (float) cos_deg(long_hi) * RADIUS;
      vert_sw.y = vert_se.y = (float) cos_deg(long_lo) * RADIUS;

     /*
      * Assign each X,Z with sin,cos values scaled by latitude radius indexed by longitude.
      * Eg, long=0 and long=180 are at the poles, so zero scale is sin(longitude),
      * while long=90 (sin(90)=1) is at equator.
      */
      vert_ne.x = (float) cos_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_se.x = (float) cos_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo                  ));
      vert_nw.x = (float) cos_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_sw.x = (float) cos_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo                  ));

      vert_ne.z = (float) sin_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_se.z = (float) sin_deg( lat_deg                 ) * (RADIUS * (float) sin_deg( long_lo                  ));
      vert_nw.z = (float) sin_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo + STEP_LONGITUDE ));
      vert_sw.z = (float) sin_deg( lat_deg + STEP_LATITUDE ) * (RADIUS * (float) sin_deg( long_lo                  ));

     /*
      * Draw the facet.
      */
      glBegin( GL_POLYGON );

      CrossProduct( vert_ne, vert_nw, vert_sw, &vert_norm );
      glNormal3f( vert_norm.x, vert_norm.y, vert_norm.z );

      glVertex3f( vert_ne.x, vert_ne.y, vert_ne.z );
      glVertex3f( vert_nw.x, vert_nw.y, vert_nw.z );
      glVertex3f( vert_sw.x, vert_sw.y, vert_sw.z );
      glVertex3f( vert_se.x, vert_se.y, vert_se.z );

      glEnd();

#if BOING_DEBUG
      printf( "----------------------------------------------------------- \n" );
      printf( "lat = %f  long_lo = %f  long_hi = %f \n", lat_deg, long_lo, long_hi );
      printf( "vert_ne  x = %.8f  y = %.8f  z = %.8f \n", vert_ne.x, vert_ne.y, vert_ne.z );
      printf( "vert_nw  x = %.8f  y = %.8f  z = %.8f \n", vert_nw.x, vert_nw.y, vert_nw.z );
      printf( "vert_se  x = %.8f  y = %.8f  z = %.8f \n", vert_se.x, vert_se.y, vert_se.z );
      printf( "vert_sw  x = %.8f  y = %.8f  z = %.8f \n", vert_sw.x, vert_sw.y, vert_sw.z );
#endif

   }

  /*
   * Toggle color so that next band will opposite red/white colors than this one.
   */
   colorToggle = ! colorToggle;

  /*
   * This circular band is done.
   */
   return;
}